

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O0

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:189:26)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:189:26)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  long *plVar1;
  long lVar2;
  long *in_RSI;
  FileName *path_00;
  Ref<embree::ParseStream> *in_stack_ffffffffffffffb0;
  anon_class_8_1_8991fb9c_for_f *in_stack_ffffffffffffffb8;
  long *local_40 [5];
  FileName *local_18;
  FileName *local_10;
  
  path_00 = (FileName *)local_40;
  plVar1 = (long *)*in_RSI;
  local_18 = path_00;
  if (plVar1 != (long *)0x0) {
    lVar2 = *local_40[0];
    local_40[0] = plVar1;
    (**(code **)(lVar2 + 0x10))();
    plVar1 = local_40[0];
  }
  local_40[0] = plVar1;
  anon_class_8_1_8991fb9c_for_f::operator()
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,path_00);
  local_10 = (FileName *)local_40;
  if (local_40[0] != (long *)0x0) {
    (**(code **)(*local_40[0] + 0x18))();
  }
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }